

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlXPathObjectPtr pxVar10;
  ulong uVar11;
  xmlXPathCompExprPtr pxVar12;
  bool bVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  double dVar17;
  void *pvVar18;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar14 = ctxt->cur;
  pbVar7 = pbVar14;
  while( true ) {
    pbVar15 = pbVar7 + 1;
    bVar3 = *pbVar7;
    uVar11 = (ulong)bVar3;
    if (0x28 < uVar11) break;
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar11 & 0x3f) & 1) != 0) goto switchD_001dbae9_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar14 = (byte *)(ulong)((int)pbVar14 + 1);
    pbVar7 = pbVar15;
  }
  if ((byte)(bVar3 - 0x30) < 10) goto switchD_001dbae9_caseD_27;
  switch(bVar3) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001dbae9_caseD_28:
    while (((byte)uVar11 < 0x21 && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar3 = *pbVar15;
      pbVar14 = (byte *)(ulong)((int)pbVar14 + 1);
      pbVar15 = pbVar15 + 1;
      uVar11 = (ulong)bVar3;
    }
    uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
LAB_001dbf26:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar4 < 0x100) {
      if ((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xdf) - 0x41) &&
         (((uVar4 < 0xf8 && 0x1e < uVar4 - 0xd8 && ((char)uVar4 != '_')) && ((uVar4 & 0xff) != 0x3a)
          ))) goto LAB_001dbf26;
    }
    else {
      iVar6 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
      if ((iVar6 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007))
      goto LAB_001dbf26;
    }
    while ((0x3e < uVar4 || ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0))) {
      if (uVar4 < 0x100) {
        if ((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xdf) - 0x41) &&
           ((9 < uVar4 - 0x30 && 0x1e < uVar4 - 0xd8) && uVar4 < 0xf8)) {
LAB_001dc358:
          if ((0x32 < uVar4 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar4 < 0x100) {
              uVar4 = (uint)(uVar4 == 0xb7);
            }
            else {
              iVar6 = xmlCharInRange(uVar4,&xmlIsCombiningGroup);
              if (iVar6 != 0) goto LAB_001dc371;
              uVar4 = xmlCharInRange(uVar4,&xmlIsExtenderGroup);
            }
            if (uVar4 == 0) break;
          }
        }
      }
      else {
        iVar6 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
        if (((iVar6 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007))
           && (iVar6 = xmlCharInRange(uVar4,&xmlIsDigitGroup), iVar6 == 0)) goto LAB_001dc358;
      }
LAB_001dc371:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar8 = xmlStrndup(pbVar15 + -1,*(int *)&ctxt->cur - (int)pbVar14);
    ctxt->cur = pbVar15 + -1;
    if (pxVar8 == (xmlChar *)0x0) goto LAB_001dbf26;
    pxVar9 = xmlStrstr(pxVar8,(xmlChar *)"::");
    if (pxVar9 == (xmlChar *)0x0) {
      iVar6 = xmlStrlen(pxVar8);
      lVar16 = (long)iVar6;
      do {
        xVar1 = ctxt->cur[lVar16];
        if (xVar1 != ' ') {
          bVar2 = false;
          if ((xVar1 == '\0') || (bVar2 = false, xVar1 == '/')) goto LAB_001dc48c;
          if ((1 < (byte)(xVar1 - 9)) && (xVar1 != '\r')) goto LAB_001dc479;
        }
        lVar16 = lVar16 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar8);
    pbVar7 = ctxt->cur;
    goto LAB_001dbafa;
  case 0x2a:
  case 0x2f:
switchD_001dbae9_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar3 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar14 = ctxt->cur;
    while( true ) {
      uVar11 = (ulong)*pbVar14;
      if (0x2f < uVar11) break;
      if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
        if (uVar11 == 0x2f) goto LAB_001dbc11;
        break;
      }
      ctxt->cur = pbVar14 + 1;
      pbVar14 = pbVar14 + 1;
    }
    goto LAB_001dbecb;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001dbafa;
    break;
  default:
    if (bVar3 == 0x40) goto switchD_001dbae9_caseD_2a;
    if (bVar3 != 0x22) goto switchD_001dbae9_caseD_28;
  }
switchD_001dbae9_caseD_27:
  pbVar7 = pbVar7 + 1;
  pbVar14 = pbVar7;
  while( true ) {
    bVar3 = pbVar14[-1];
    uVar11 = (ulong)bVar3;
    if (0x28 < uVar11) break;
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
      if (uVar11 == 0x24) {
        ctxt->cur = pbVar14;
        pxVar8 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar8 != (xmlChar *)0x0) {
          ctxt->comp->last = -1;
          iVar6 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar8,
                                      (void *)CONCAT44(local_48._4_4_,(int)local_48));
          if (iVar6 == -1) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
            (*xmlFree)(pxVar8);
          }
          pbVar14 = ctxt->cur;
          while( true ) {
            if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
            break;
            ctxt->cur = pbVar14 + 1;
            pbVar14 = pbVar14 + 1;
          }
          if ((ctxt->context != (xmlXPathContextPtr)0x0) && ((ctxt->context->flags & 2) != 0)) {
            iVar6 = 0x18;
            goto LAB_001dc04b;
          }
          goto LAB_001dc054;
        }
        (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        iVar6 = 4;
        goto LAB_001dc04b;
      }
      if (uVar11 == 0x28) goto LAB_001db9a5;
      break;
    }
    ctxt->cur = pbVar14;
    pbVar14 = pbVar14 + 1;
    pbVar7 = pbVar7 + 1;
  }
  if ((byte)(bVar3 - 0x30) < 10) {
LAB_001db9c8:
    if (ctxt->error == 0) {
      if (bVar3 != 0x2e && bVar3 < 0x30) goto LAB_001db9e6;
      pvVar18 = (void *)0x0;
      bVar13 = true;
      bVar2 = false;
      while( true ) {
        uVar4 = (uint)uVar11;
        if (9 < (byte)((char)uVar11 - 0x30U)) break;
        ctxt->cur = pbVar14;
        pvVar18 = (void *)((double)pvVar18 * 10.0 + (double)(uVar4 & 0xffffff0f));
        uVar11 = (ulong)*pbVar14;
        pbVar14 = pbVar14 + 1;
        bVar2 = true;
        bVar13 = false;
      }
      if ((char)uVar11 == '.') {
        ctxt->cur = pbVar14;
        bVar3 = *pbVar14;
        if (bVar3 < 0x30) {
          if (!bVar13) {
LAB_001dc0a4:
            uVar11 = 0;
            while (bVar3 == 0x30) {
              lVar16 = uVar11 + 1;
              ctxt->cur = pbVar14 + lVar16;
              uVar11 = uVar11 + 1;
              bVar3 = pbVar14[lVar16];
            }
            pbVar14 = pbVar14 + uVar11;
            iVar6 = (int)uVar11;
            local_38 = 0.0;
            while( true ) {
              pbVar14 = pbVar14 + 1;
              uVar4 = (uint)uVar11;
              if ((9 < (byte)(bVar3 - 0x30)) || (iVar6 + 0x14U <= uVar4)) break;
              local_38 = local_38 * 10.0 + (double)(int)(bVar3 - 0x30);
              uVar11 = (ulong)(uVar4 + 1);
              ctxt->cur = pbVar14;
              bVar3 = *pbVar14;
            }
            local_40 = pvVar18;
            dVar17 = pow(10.0,(double)(int)uVar4);
            pbVar14 = ctxt->cur;
            while (uVar4 = (uint)*pbVar14, (byte)(*pbVar14 - 0x30) < 10) {
              pbVar14 = pbVar14 + 1;
              ctxt->cur = pbVar14;
            }
            pvVar18 = (void *)((double)local_40 + local_38 / dVar17);
            goto LAB_001dc13a;
          }
        }
        else if (bVar2 || bVar3 < 0x3a) goto LAB_001dc0a4;
LAB_001db9e6:
        iVar6 = 1;
        goto LAB_001dc04b;
      }
      pbVar14 = pbVar14 + -1;
LAB_001dc13a:
      if ((uVar4 | 0x20) == 0x65) {
        pbVar7 = pbVar14 + 1;
        ctxt->cur = pbVar7;
        bVar3 = pbVar14[1];
        if ((bVar3 != 0x2d) && (iVar6 = 0, bVar3 != 0x2b)) goto LAB_001dc4da;
        pbVar7 = pbVar14 + 2;
        iVar6 = 0;
        while( true ) {
          ctxt->cur = pbVar7;
LAB_001dc4da:
          if (9 < (byte)(*pbVar7 - 0x30)) break;
          if (iVar6 < 1000000) {
            iVar6 = iVar6 * 10 + -0x30 + (uint)*pbVar7;
          }
          pbVar7 = pbVar7 + 1;
        }
        iVar5 = -iVar6;
        if (bVar3 != 0x2d) {
          iVar5 = iVar6;
        }
        local_40 = pvVar18;
        dVar17 = pow(10.0,(double)iVar5);
        pvVar18 = (void *)((double)local_40 * dVar17);
      }
      pxVar10 = xmlXPathCacheNewFloat(ctxt->context,(double)pvVar18);
      if (pxVar10 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar6 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar10,
                                    (void *)0x0);
        if (iVar6 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar10);
        }
      }
    }
  }
  else {
    pbVar15 = pbVar14;
    if (bVar3 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar4 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001dc472;
            goto LAB_001dbdc0;
          }
        } while (uVar4 == 0);
        if (uVar4 == 0x22) break;
LAB_001dbdc0:
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      if (bVar3 != 0x27) {
        if ((bVar3 != 0x2e) || (9 < (byte)(*pbVar14 - 0x30))) {
          pxVar8 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
          if (pxVar8 == (xmlChar *)0x0) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
          else {
            uVar4 = 1;
            iVar6 = -1;
            pbVar14 = ctxt->cur;
            while( true ) {
              pbVar7 = pbVar14 + 1;
              uVar11 = (ulong)*pbVar14;
              if (0x28 < uVar11) break;
              if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
                if (uVar11 == 0x28) goto LAB_001dbf49;
                break;
              }
              ctxt->cur = pbVar7;
              pbVar14 = pbVar7;
            }
            (*xmlFree)(pxVar8);
            pvVar18 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
LAB_001dc046:
            (*xmlFree)(pvVar18);
          }
          iVar6 = 7;
          goto LAB_001dc04b;
        }
        goto LAB_001db9c8;
      }
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar4 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001dc472;
            goto LAB_001dbd8b;
          }
        } while (uVar4 == 0);
        if (uVar4 == 0x27) break;
LAB_001dbd8b:
        pbVar15 = pbVar15 + 1;
      }
    }
    pxVar8 = xmlStrndup(pbVar14,(int)pbVar15 - (int)pbVar7);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (pxVar8 != (xmlChar *)0x0) {
      pxVar10 = xmlXPathCacheNewString(ctxt->context,pxVar8);
      if (pxVar10 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar6 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar10,
                                    (void *)0x0);
        if (iVar6 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar10);
        }
      }
      (*xmlFree)(pxVar8);
    }
  }
  goto LAB_001dc054;
LAB_001dc479:
  if (((xVar1 == '(') && (iVar6 = xmlXPathIsNodeType(pxVar8), iVar6 == 0)) &&
     ((ctxt->xptr == 0 || (iVar6 = xmlStrEqual(pxVar8,(xmlChar *)"range-to"), iVar6 == 0)))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
LAB_001dc48c:
  xVar1 = ctxt->cur[lVar16];
  (*xmlFree)(pxVar8);
  pbVar7 = ctxt->cur;
  if ((!bVar2) || (xVar1 == '\0')) {
LAB_001dbafa:
    bVar3 = *pbVar7;
    goto switchD_001dbae9_caseD_2a;
  }
  goto switchD_001dbae9_caseD_27;
LAB_001dbc11:
  do {
    pbVar14 = ctxt->cur;
    if (*pbVar14 != 0x2f) break;
    if (pbVar14[1] == 0x2f) {
      pbVar14 = pbVar14 + 2;
      while( true ) {
        ctxt->cur = pbVar14;
        if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
        break;
        pbVar14 = pbVar14 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001dbca4:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
        bVar3 = *pbVar14;
        uVar11 = (ulong)bVar3;
        if (0x20 < uVar11) goto LAB_001dbc58;
      } while ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0);
      if (uVar11 != 0) {
LAB_001dbc58:
        if (((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar3 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar3 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001dbca4;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001dbed3;
LAB_001db9a5:
  while( true ) {
    ctxt->cur = pbVar14;
    if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0)) break;
    pbVar14 = pbVar14 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar14 = ctxt->cur;
    if (*pbVar14 == 0x29) {
      do {
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
        if (0x20 < (ulong)*pbVar14) break;
      } while ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0);
      goto LAB_001dc054;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001dbcc6;
LAB_001dc472:
  iVar6 = 2;
LAB_001dc04b:
  xmlXPathErr(ctxt,iVar6);
  goto LAB_001dc054;
LAB_001dbf49:
  while( true ) {
    ctxt->cur = pbVar7;
    if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
    pbVar7 = pbVar7 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  if ((local_40 == (void *)0x0) && (*pxVar8 == 'c')) {
    iVar5 = xmlStrEqual(pxVar8,(xmlChar *)"count");
    uVar4 = (uint)(iVar5 == 0);
    pbVar7 = ctxt->cur;
  }
  pxVar12 = ctxt->comp;
  pxVar12->last = -1;
  uVar11 = (ulong)*pbVar7;
  iVar5 = 0;
  if (*pbVar7 != 0x29) {
    iVar5 = 0;
    while ((char)uVar11 != '\0') {
      iVar6 = pxVar12->last;
      pxVar12->last = -1;
      xmlXPathCompileExpr(ctxt,uVar4);
      if (ctxt->error != 0) {
        (*xmlFree)(pxVar8);
        (*xmlFree)(local_40);
        goto LAB_001dc054;
      }
      xmlXPathCompExprAdd(ctxt,iVar6,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
      iVar5 = iVar5 + 1;
      pbVar14 = ctxt->cur;
      if (*pbVar14 != 0x2c) {
        if (*pbVar14 != 0x29) {
          (*xmlFree)(pxVar8);
          pvVar18 = local_40;
          goto LAB_001dc046;
        }
        pxVar12 = ctxt->comp;
        break;
      }
      do {
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
        uVar11 = (ulong)*pbVar14;
        if (0x20 < uVar11) break;
      } while ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0);
      pxVar12 = ctxt->comp;
    }
    iVar6 = pxVar12->last;
  }
  pvVar18 = local_40;
  iVar6 = xmlXPathCompExprAdd(ctxt,iVar6,-1,XPATH_OP_FUNCTION,iVar5,0,0,pxVar8,local_40);
  if (iVar6 == -1) {
    (*xmlFree)(pvVar18);
    (*xmlFree)(pxVar8);
  }
  pbVar14 = ctxt->cur;
  if (*pbVar14 != 0) goto LAB_001dc58e;
  while (((ulong)*pbVar14 < 0x21 && ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0))) {
LAB_001dc58e:
    pbVar14 = pbVar14 + 1;
    ctxt->cur = pbVar14;
  }
LAB_001dc054:
  pbVar14 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar14 + 1;
    pbVar14 = pbVar14 + 1;
  }
LAB_001dbcc6:
  if (ctxt->error == 0) {
    pbVar14 = ctxt->cur;
    while ((uVar11 = (ulong)*pbVar14, uVar11 < 0x21 && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))
          ) {
      pbVar14 = pbVar14 + 1;
      ctxt->cur = pbVar14;
    }
    while ((char)uVar11 == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar14 = ctxt->cur;
      while ((uVar11 = (ulong)*pbVar14, uVar11 < 0x21 &&
             ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
      }
    }
    if (ctxt->error == 0) {
      if ((char)uVar11 == '/') {
        if (pbVar14[1] == 0x2f) {
          pbVar14 = pbVar14 + 2;
          while( true ) {
            ctxt->cur = pbVar14;
            if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
            break;
            pbVar14 = pbVar14 + 1;
          }
          xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,
                              (void *)0x0);
        }
LAB_001dbecb:
        xmlXPathCompRelativeLocationPath(ctxt);
      }
LAB_001dbed3:
      pbVar14 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar14) || ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar14 + 1;
        pbVar14 = pbVar14 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}